

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2measures.cc
# Opt level: O2

double S2::GirardArea(S2Point *a,S2Point *b,S2Point *c)

{
  FloatType FVar1;
  FloatType FVar2;
  FloatType FVar3;
  double dVar4;
  Vector3_d ac;
  Vector3_d bc;
  Vector3_d ab;
  Vector3_d local_70;
  Vector3_d local_58;
  Vector3_d local_40;
  
  RobustCrossProd(&local_40,a,b);
  RobustCrossProd(&local_58,b,c);
  RobustCrossProd(&local_70,a,c);
  FVar1 = Vector3<double>::Angle(&local_40,&local_70);
  FVar2 = Vector3<double>::Angle(&local_40,&local_58);
  FVar3 = Vector3<double>::Angle(&local_58,&local_70);
  dVar4 = FVar3 + (FVar1 - FVar2);
  if (dVar4 <= 0.0) {
    dVar4 = 0.0;
  }
  return dVar4;
}

Assistant:

double GirardArea(const S2Point& a, const S2Point& b, const S2Point& c) {
  // This is equivalent to the usual Girard's formula but is slightly more
  // accurate, faster to compute, and handles a == b == c without a special
  // case.  RobustCrossProd() is necessary to get good accuracy when two of
  // the input points are very close together.

  Vector3_d ab = RobustCrossProd(a, b);
  Vector3_d bc = RobustCrossProd(b, c);
  Vector3_d ac = RobustCrossProd(a, c);
  return max(0.0, ab.Angle(ac) - ab.Angle(bc) + bc.Angle(ac));
}